

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

GLMClassifier * __thiscall CoreML::Specification::Model::mutable_glmclassifier(Model *this)

{
  bool bVar1;
  GLMClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_glmclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_glmclassifier(this);
    this_00 = (GLMClassifier *)operator_new(0x58);
    GLMClassifier::GLMClassifier(this_00);
    (this->Type_).glmclassifier_ = this_00;
  }
  return (GLMClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::GLMClassifier* Model::mutable_glmclassifier() {
  if (!has_glmclassifier()) {
    clear_Type();
    set_has_glmclassifier();
    Type_.glmclassifier_ = new ::CoreML::Specification::GLMClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.glmClassifier)
  return Type_.glmclassifier_;
}